

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O1

void __thiscall
asio::detail::initiate_async_read<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>::
operator()(initiate_async_read<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>> *this
          ,_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>
           *handler,mutable_buffers_1 *buffers,transfer_all_t *completion_cond)

{
  undefined1 auVar1 [16];
  offset_in_rpc_session_to_subr oVar2;
  undefined8 uVar3;
  ulong uVar4;
  _Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  local_98;
  read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
  local_70;
  
  oVar2 = handler->_M_f;
  uVar3 = *(undefined8 *)&handler->field_0x8;
  std::
  _Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::_Tuple_impl(&local_98,
                &(handler->_M_bound_args).
                 super__Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               );
  local_70.stream_ = *(basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> **)this;
  local_70.buffers_.super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
  super_mutable_buffer.data_ = (buffers->super_mutable_buffer).data_;
  local_70.buffers_.super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
  super_mutable_buffer.size_ = (buffers->super_mutable_buffer).size_;
  local_70.buffers_.super_consuming_single_buffer<asio::mutable_buffers_1>.total_consumed_ = 0;
  local_70.start_ = 0;
  local_70.handler_._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .
  super__Tuple_impl<1UL,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .super__Head_base<1UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_98.
       super__Tuple_impl<1UL,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
       .super__Head_base<1UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
       super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70.handler_._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .
  super__Tuple_impl<1UL,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .super__Head_base<1UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_98.
       super__Tuple_impl<1UL,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
       .super__Head_base<1UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
       super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_98.
  super__Tuple_impl<1UL,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .super__Head_base<1UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_98.
  super__Tuple_impl<1UL,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .super__Head_base<1UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70.handler_._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_98.super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
       super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70.handler_._M_bound_args.
  super__Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  .super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_98.super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
       super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_98.super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_98.super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
  super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70.handler_._M_f = oVar2;
  local_70.handler_._8_8_ = uVar3;
  uVar4 = std::_V2::system_category();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::rpc_session::*(std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::buffer>,_const_std::error_code_&,_unsigned_long)>_>
  ::operator()(&local_70,(error_code)(auVar1 << 0x40),0,1);
  if (local_70.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
      super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.handler_._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
               super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_70.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<1UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
      super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.handler_._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<nuraft::rpc_session>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .
               super__Tuple_impl<1UL,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .super__Head_base<1UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_98.super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>._M_head_impl.
      super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super__Head_base<0UL,_std::shared_ptr<nuraft::rpc_session>,_false>.
               _M_head_impl.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_98.
      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<1UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
      super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.
               super__Tuple_impl<1UL,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .super__Head_base<1UL,_std::shared_ptr<nuraft::buffer>,_false>._M_head_impl.
               super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void operator()(ASIO_MOVE_ARG(ReadHandler) handler,
        const MutableBufferSequence& buffers,
        ASIO_MOVE_ARG(CompletionCondition) completion_cond) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a ReadHandler.
      ASIO_READ_HANDLER_CHECK(ReadHandler, handler) type_check;

      non_const_lvalue<ReadHandler> handler2(handler);
      non_const_lvalue<CompletionCondition> completion_cond2(completion_cond);
      start_read_op(stream_, buffers,
          asio::buffer_sequence_begin(buffers),
          completion_cond2.value, handler2.value);
    }